

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csmPointCloud.cpp
# Opt level: O0

void __thiscall
csm::ModelBounds::ModelBounds
          (ModelBounds *this,ModelCoord *center,double dim0,double dim1,double dim2)

{
  Error *this_00;
  int __x;
  ModelVector *this_01;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  ErrorType local_34;
  double local_30;
  double dim2_local;
  double dim1_local;
  double dim0_local;
  ModelCoord *center_local;
  ModelBounds *this_local;
  
  (this->theCenter).m0 = center->m0;
  (this->theCenter).m1 = center->m1;
  (this->theCenter).m2 = center->m2;
  local_30 = dim2;
  dim2_local = dim1;
  dim1_local = dim0;
  dim0_local = (double)center;
  center_local = &this->theCenter;
  ModelVector::ModelVector(&this->theA0,1.0,0.0,0.0);
  ModelVector::ModelVector(&this->theA1,0.0,1.0,0.0);
  this_01 = &this->theA2;
  ModelVector::ModelVector(this_01,0.0,0.0,1.0);
  __x = (int)this_01;
  std::abs(__x);
  this->theDim0 = extraout_XMM0_Qa;
  std::abs(__x);
  this->theDim1 = extraout_XMM0_Qa_00;
  std::abs(__x);
  this->theDim2 = extraout_XMM0_Qa_01;
  if (((0.0 < this->theDim0) && (0.0 < this->theDim1)) && (0.0 < this->theDim2)) {
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x50);
  local_34 = ILLEGAL_MATH_OPERATION;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"ModelBounds dimension is not a positive value",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"ModelBounds constructor",&local_91);
  Error::Error(this_00,&local_34,&local_58,&local_90);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

ModelBounds::ModelBounds(const ModelCoord& center,
                         double dim0,
                         double dim1,
                         double dim2)
   :
      theCenter (center),
      theA0     (1.0, 0.0, 0.0),
      theA1     (0.0, 1.0, 0.0),
      theA2     (0.0, 0.0, 1.0),
      theDim0   (std::abs(dim0)),
      theDim1   (std::abs(dim1)),
      theDim2   (std::abs(dim2))
{
   // check for errors in dimensions
   if ((theDim0 <= 0.0) || (theDim1 <= 0.0) || (theDim2 <= 0.0))
   {
      throw csm::Error(csm::Error::ILLEGAL_MATH_OPERATION,
                       "ModelBounds dimension is not a positive value",
                       "ModelBounds constructor");
   }
}